

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_arithm<float>(uint length,float value1,float value2,bool allowTrash)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 (*pauVar28) [16];
  undefined8 *puVar29;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var30;
  ulong uVar31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var32;
  undefined1 (*pauVar33) [16];
  uint uVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var50;
  undefined1 auVar51 [16];
  float fVar52;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var53;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var54;
  shared_ptr<float> pv1;
  shared_ptr<float> pv2;
  shared_ptr<float> presult;
  
  uVar37 = (ulong)length;
  uVar31 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar31 = uVar37 * 4;
  }
  pauVar28 = (undefined1 (*) [16])operator_new__(uVar31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,pauVar28,nosimd::common::free<float>
            );
  pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<float>);
  uVar31 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar31 = (ulong)(length + 1) * 4;
  }
  pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,
             pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<float>);
  *(undefined4 *)
   ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar37 * 4) = 0x42fe0000;
  pauVar33 = pauVar28;
  uVar34 = length;
  uVar35 = length;
  if (0xf < (int)length) {
    do {
      *(float *)*pauVar33 = value1;
      *(float *)(*pauVar33 + 4) = value1;
      *(float *)(*pauVar33 + 8) = value1;
      *(float *)(*pauVar33 + 0xc) = value1;
      *(float *)pauVar33[1] = value1;
      *(float *)(pauVar33[1] + 4) = value1;
      *(float *)(pauVar33[1] + 8) = value1;
      *(float *)(pauVar33[1] + 0xc) = value1;
      *(float *)pauVar33[2] = value1;
      *(float *)(pauVar33[2] + 4) = value1;
      *(float *)(pauVar33[2] + 8) = value1;
      *(float *)(pauVar33[2] + 0xc) = value1;
      *(float *)pauVar33[3] = value1;
      *(float *)(pauVar33[3] + 4) = value1;
      *(float *)(pauVar33[3] + 8) = value1;
      *(float *)(pauVar33[3] + 0xc) = value1;
      uVar34 = uVar35 - 0x10;
      pauVar33 = pauVar33 + 4;
      bVar1 = 0x1f < uVar35;
      uVar35 = uVar34;
    } while (bVar1);
  }
  if (7 < (int)uVar34) {
    *(float *)*pauVar33 = value1;
    *(float *)(*pauVar33 + 4) = value1;
    *(float *)(*pauVar33 + 8) = value1;
    *(float *)(*pauVar33 + 0xc) = value1;
    *(float *)pauVar33[1] = value1;
    *(float *)(pauVar33[1] + 4) = value1;
    *(float *)(pauVar33[1] + 8) = value1;
    *(float *)(pauVar33[1] + 0xc) = value1;
    uVar34 = uVar34 - 8;
    pauVar33 = pauVar33 + 2;
  }
  if (3 < (int)uVar34) {
    *(float *)*pauVar33 = value1;
    *(float *)(*pauVar33 + 4) = value1;
    *(float *)(*pauVar33 + 8) = value1;
    *(float *)(*pauVar33 + 0xc) = value1;
    uVar34 = uVar34 - 4;
    pauVar33 = pauVar33 + 1;
  }
  if (0 < (int)uVar34) {
    uVar34 = uVar34 + 1;
    do {
      *(float *)*pauVar33 = value1;
      pauVar33 = (undefined1 (*) [16])(*pauVar33 + 4);
      uVar34 = uVar34 - 1;
    } while (1 < uVar34);
  }
  _Var38._vptr__Sp_counted_base = CONCAT44(value2,value2);
  _Var38._M_use_count = (_Atomic_word)value2;
  _Var38._M_weak_count = (_Atomic_word)value2;
  _Var30 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar34 = length;
  uVar35 = length;
  if (0xf < (int)length) {
    do {
      *_Var30._M_pi = _Var38;
      _Var30._M_pi[1] = _Var38;
      _Var30._M_pi[2] = _Var38;
      _Var30._M_pi[3] = _Var38;
      uVar34 = uVar35 - 0x10;
      _Var30._M_pi = _Var30._M_pi + 4;
      bVar1 = 0x1f < uVar35;
      uVar35 = uVar34;
    } while (bVar1);
  }
  if (7 < (int)uVar34) {
    *_Var30._M_pi = _Var38;
    _Var30._M_pi[1] = _Var38;
    uVar34 = uVar34 - 8;
    _Var30._M_pi = _Var30._M_pi + 2;
  }
  if (3 < (int)uVar34) {
    *_Var30._M_pi = _Var38;
    uVar34 = uVar34 - 4;
    _Var30._M_pi = _Var30._M_pi + 1;
  }
  if (0 < (int)uVar34) {
    uVar34 = uVar34 + 1;
    do {
      *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = value2;
      _Var30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4);
      uVar34 = uVar34 - 1;
    } while (1 < uVar34);
  }
  if (length != 0) {
    uVar31 = 0;
    do {
      fVar41 = *(float *)(*pauVar28 + uVar31 * 4) - value1;
      uVar34 = -(uint)(fVar41 < 0.0);
      if ((1.1920929e-07 <=
           (float)(~uVar34 & (uint)fVar41 |
                  (uint)(value1 - *(float *)(*pauVar28 + uVar31 * 4)) & uVar34)) ||
         (fVar41 = *(float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar31 * 4),
         fVar42 = fVar41 - value2, uVar34 = -(uint)(fVar42 < 0.0),
         1.1920929e-07 <= (float)(~uVar34 & (uint)fVar42 | (uint)(value2 - fVar41) & uVar34))) {
        puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar29 + 1) = 0x1a;
        *(uint *)((long)puVar29 + 0xc) = length;
        __cxa_throw(puVar29,&Exception::typeinfo,0);
      }
      uVar31 = uVar31 + 1;
    } while (uVar37 != uVar31);
    _Var30._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var32 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    pauVar33 = pauVar28;
    uVar34 = length;
    uVar35 = length;
    if (0xf < (int)length) {
      do {
        fVar41 = *(float *)(*pauVar33 + 4);
        fVar42 = *(float *)(*pauVar33 + 8);
        fVar43 = *(float *)(*pauVar33 + 0xc);
        fVar44 = *(float *)pauVar33[1];
        fVar49 = *(float *)(pauVar33[1] + 4);
        fVar52 = *(float *)(pauVar33[1] + 8);
        fVar2 = *(float *)(pauVar33[1] + 0xc);
        fVar3 = *(float *)pauVar33[2];
        fVar4 = *(float *)(pauVar33[2] + 4);
        fVar5 = *(float *)(pauVar33[2] + 8);
        fVar6 = *(float *)(pauVar33[2] + 0xc);
        fVar7 = *(float *)pauVar33[3];
        fVar8 = *(float *)(pauVar33[3] + 4);
        fVar9 = *(float *)(pauVar33[3] + 8);
        fVar10 = *(float *)(pauVar33[3] + 0xc);
        fVar11 = *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4);
        fVar12 = (float)(_Var32._M_pi)->_M_use_count;
        fVar13 = (float)(_Var32._M_pi)->_M_weak_count;
        fVar14 = *(float *)&_Var32._M_pi[1]._vptr__Sp_counted_base;
        fVar15 = *(float *)((long)&_Var32._M_pi[1]._vptr__Sp_counted_base + 4);
        fVar16 = (float)_Var32._M_pi[1]._M_use_count;
        fVar17 = (float)_Var32._M_pi[1]._M_weak_count;
        fVar18 = *(float *)&_Var32._M_pi[2]._vptr__Sp_counted_base;
        fVar19 = *(float *)((long)&_Var32._M_pi[2]._vptr__Sp_counted_base + 4);
        fVar20 = (float)_Var32._M_pi[2]._M_use_count;
        fVar21 = (float)_Var32._M_pi[2]._M_weak_count;
        fVar22 = *(float *)&_Var32._M_pi[3]._vptr__Sp_counted_base;
        fVar23 = *(float *)((long)&_Var32._M_pi[3]._vptr__Sp_counted_base + 4);
        fVar24 = (float)_Var32._M_pi[3]._M_use_count;
        fVar25 = (float)_Var32._M_pi[3]._M_weak_count;
        *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
             *(float *)&(_Var32._M_pi)->_vptr__Sp_counted_base + *(float *)*pauVar33;
        *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar11 + fVar41;
        (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar12 + fVar42);
        (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar13 + fVar43);
        *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar14 + fVar44;
        *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar15 + fVar49;
        _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar16 + fVar52);
        _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar17 + fVar2);
        *(float *)&_Var30._M_pi[2]._vptr__Sp_counted_base = fVar18 + fVar3;
        *(float *)((long)&_Var30._M_pi[2]._vptr__Sp_counted_base + 4) = fVar19 + fVar4;
        _Var30._M_pi[2]._M_use_count = (_Atomic_word)(fVar20 + fVar5);
        _Var30._M_pi[2]._M_weak_count = (_Atomic_word)(fVar21 + fVar6);
        *(float *)&_Var30._M_pi[3]._vptr__Sp_counted_base = fVar22 + fVar7;
        *(float *)((long)&_Var30._M_pi[3]._vptr__Sp_counted_base + 4) = fVar23 + fVar8;
        _Var30._M_pi[3]._M_use_count = (_Atomic_word)(fVar24 + fVar9);
        _Var30._M_pi[3]._M_weak_count = (_Atomic_word)(fVar25 + fVar10);
        uVar35 = uVar34 - 0x10;
        pauVar33 = pauVar33 + 4;
        _Var32._M_pi = _Var32._M_pi + 4;
        _Var30._M_pi = _Var30._M_pi + 4;
        bVar1 = 0x1f < uVar34;
        uVar34 = uVar35;
      } while (bVar1);
    }
    uVar34 = uVar35;
    if (7 < (int)uVar35) {
      do {
        fVar41 = *(float *)(*pauVar33 + 4);
        fVar42 = *(float *)(*pauVar33 + 8);
        fVar43 = *(float *)(*pauVar33 + 0xc);
        fVar44 = *(float *)pauVar33[1];
        fVar49 = *(float *)(pauVar33[1] + 4);
        fVar52 = *(float *)(pauVar33[1] + 8);
        fVar2 = *(float *)(pauVar33[1] + 0xc);
        fVar3 = *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4);
        fVar4 = (float)(_Var32._M_pi)->_M_use_count;
        fVar5 = (float)(_Var32._M_pi)->_M_weak_count;
        fVar6 = *(float *)&_Var32._M_pi[1]._vptr__Sp_counted_base;
        fVar7 = *(float *)((long)&_Var32._M_pi[1]._vptr__Sp_counted_base + 4);
        fVar8 = (float)_Var32._M_pi[1]._M_use_count;
        fVar9 = (float)_Var32._M_pi[1]._M_weak_count;
        *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
             *(float *)&(_Var32._M_pi)->_vptr__Sp_counted_base + *(float *)*pauVar33;
        *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar3 + fVar41;
        (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar4 + fVar42);
        (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar5 + fVar43);
        *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar6 + fVar44;
        *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar7 + fVar49;
        _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar8 + fVar52);
        _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar9 + fVar2);
        uVar35 = uVar34 - 8;
        pauVar33 = pauVar33 + 2;
        _Var32._M_pi = _Var32._M_pi + 2;
        _Var30._M_pi = _Var30._M_pi + 2;
        bVar1 = 0xf < uVar34;
        uVar34 = uVar35;
      } while (bVar1);
    }
    if (3 < (int)uVar35) {
      fVar41 = *(float *)(*pauVar33 + 4);
      fVar42 = *(float *)(*pauVar33 + 8);
      fVar43 = *(float *)(*pauVar33 + 0xc);
      fVar44 = *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4);
      fVar49 = (float)(_Var32._M_pi)->_M_use_count;
      fVar52 = (float)(_Var32._M_pi)->_M_weak_count;
      *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
           *(float *)&(_Var32._M_pi)->_vptr__Sp_counted_base + *(float *)*pauVar33;
      *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar44 + fVar41;
      (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar49 + fVar42);
      (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar52 + fVar43);
      uVar35 = uVar35 - 4;
      pauVar33 = pauVar33 + 1;
      _Var32._M_pi = _Var32._M_pi + 1;
      _Var30._M_pi = _Var30._M_pi + 1;
    }
    if (0 < (int)uVar35) {
      uVar35 = uVar35 + 1;
      lVar36 = 0;
      do {
        *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36) =
             *(float *)(*pauVar33 + lVar36) +
             *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + lVar36);
        lVar36 = lVar36 + 4;
        uVar35 = uVar35 - 1;
      } while (1 < uVar35);
    }
    if (length != 0) {
      fVar41 = value1 + value2;
      uVar31 = 0;
      do {
        fVar42 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar31 * 4);
        fVar43 = fVar42 - fVar41;
        uVar34 = -(uint)(fVar43 < 0.0);
        if (1.1920929e-07 <= (float)(~uVar34 & (uint)fVar43 | (uint)(fVar41 - fVar42) & uVar34)) {
          puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
          *(undefined4 *)(puVar29 + 1) = 0x22;
          *(uint *)((long)puVar29 + 0xc) = length;
          __cxa_throw(puVar29,&Exception::typeinfo,0);
        }
        uVar31 = uVar31 + 1;
      } while (uVar37 != uVar31);
      _Var30._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      _Var32 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      pauVar33 = pauVar28;
      uVar34 = length;
      uVar35 = length;
      if (0xf < (int)length) {
        do {
          fVar42 = *(float *)(*pauVar33 + 4);
          fVar43 = *(float *)(*pauVar33 + 8);
          fVar44 = *(float *)(*pauVar33 + 0xc);
          fVar49 = *(float *)pauVar33[1];
          fVar52 = *(float *)(pauVar33[1] + 4);
          fVar2 = *(float *)(pauVar33[1] + 8);
          fVar3 = *(float *)(pauVar33[1] + 0xc);
          fVar4 = *(float *)pauVar33[2];
          fVar5 = *(float *)(pauVar33[2] + 4);
          fVar6 = *(float *)(pauVar33[2] + 8);
          fVar7 = *(float *)(pauVar33[2] + 0xc);
          fVar8 = *(float *)pauVar33[3];
          fVar9 = *(float *)(pauVar33[3] + 4);
          fVar10 = *(float *)(pauVar33[3] + 8);
          fVar11 = *(float *)(pauVar33[3] + 0xc);
          fVar12 = *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4);
          fVar13 = (float)(_Var32._M_pi)->_M_use_count;
          fVar14 = (float)(_Var32._M_pi)->_M_weak_count;
          fVar15 = *(float *)&_Var32._M_pi[1]._vptr__Sp_counted_base;
          fVar16 = *(float *)((long)&_Var32._M_pi[1]._vptr__Sp_counted_base + 4);
          fVar17 = (float)_Var32._M_pi[1]._M_use_count;
          fVar18 = (float)_Var32._M_pi[1]._M_weak_count;
          fVar19 = *(float *)&_Var32._M_pi[2]._vptr__Sp_counted_base;
          fVar20 = *(float *)((long)&_Var32._M_pi[2]._vptr__Sp_counted_base + 4);
          fVar21 = (float)_Var32._M_pi[2]._M_use_count;
          fVar22 = (float)_Var32._M_pi[2]._M_weak_count;
          fVar23 = *(float *)&_Var32._M_pi[3]._vptr__Sp_counted_base;
          fVar24 = *(float *)((long)&_Var32._M_pi[3]._vptr__Sp_counted_base + 4);
          fVar25 = (float)_Var32._M_pi[3]._M_use_count;
          fVar26 = (float)_Var32._M_pi[3]._M_weak_count;
          *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
               *(float *)*pauVar33 - *(float *)&(_Var32._M_pi)->_vptr__Sp_counted_base;
          *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar42 - fVar12;
          (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar43 - fVar13);
          (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar44 - fVar14);
          *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar49 - fVar15;
          *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar52 - fVar16;
          _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar2 - fVar17);
          _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar3 - fVar18);
          *(float *)&_Var30._M_pi[2]._vptr__Sp_counted_base = fVar4 - fVar19;
          *(float *)((long)&_Var30._M_pi[2]._vptr__Sp_counted_base + 4) = fVar5 - fVar20;
          _Var30._M_pi[2]._M_use_count = (_Atomic_word)(fVar6 - fVar21);
          _Var30._M_pi[2]._M_weak_count = (_Atomic_word)(fVar7 - fVar22);
          *(float *)&_Var30._M_pi[3]._vptr__Sp_counted_base = fVar8 - fVar23;
          *(float *)((long)&_Var30._M_pi[3]._vptr__Sp_counted_base + 4) = fVar9 - fVar24;
          _Var30._M_pi[3]._M_use_count = (_Atomic_word)(fVar10 - fVar25);
          _Var30._M_pi[3]._M_weak_count = (_Atomic_word)(fVar11 - fVar26);
          uVar35 = uVar34 - 0x10;
          pauVar33 = pauVar33 + 4;
          _Var32._M_pi = _Var32._M_pi + 4;
          _Var30._M_pi = _Var30._M_pi + 4;
          bVar1 = 0x1f < uVar34;
          uVar34 = uVar35;
        } while (bVar1);
      }
      uVar34 = uVar35;
      if (7 < (int)uVar35) {
        do {
          fVar42 = *(float *)(*pauVar33 + 4);
          fVar43 = *(float *)(*pauVar33 + 8);
          fVar44 = *(float *)(*pauVar33 + 0xc);
          fVar49 = *(float *)pauVar33[1];
          fVar52 = *(float *)(pauVar33[1] + 4);
          fVar2 = *(float *)(pauVar33[1] + 8);
          fVar3 = *(float *)(pauVar33[1] + 0xc);
          fVar4 = *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4);
          fVar5 = (float)(_Var32._M_pi)->_M_use_count;
          fVar6 = (float)(_Var32._M_pi)->_M_weak_count;
          fVar7 = *(float *)&_Var32._M_pi[1]._vptr__Sp_counted_base;
          fVar8 = *(float *)((long)&_Var32._M_pi[1]._vptr__Sp_counted_base + 4);
          fVar9 = (float)_Var32._M_pi[1]._M_use_count;
          fVar10 = (float)_Var32._M_pi[1]._M_weak_count;
          *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
               *(float *)*pauVar33 - *(float *)&(_Var32._M_pi)->_vptr__Sp_counted_base;
          *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar42 - fVar4;
          (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar43 - fVar5);
          (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar44 - fVar6);
          *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar49 - fVar7;
          *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar52 - fVar8;
          _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar2 - fVar9);
          _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar3 - fVar10);
          uVar35 = uVar34 - 8;
          pauVar33 = pauVar33 + 2;
          _Var32._M_pi = _Var32._M_pi + 2;
          _Var30._M_pi = _Var30._M_pi + 2;
          bVar1 = 0xf < uVar34;
          uVar34 = uVar35;
        } while (bVar1);
      }
      if (3 < (int)uVar35) {
        fVar42 = *(float *)(*pauVar33 + 4);
        fVar43 = *(float *)(*pauVar33 + 8);
        fVar44 = *(float *)(*pauVar33 + 0xc);
        fVar49 = *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4);
        fVar52 = (float)(_Var32._M_pi)->_M_use_count;
        fVar2 = (float)(_Var32._M_pi)->_M_weak_count;
        *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
             *(float *)*pauVar33 - *(float *)&(_Var32._M_pi)->_vptr__Sp_counted_base;
        *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar42 - fVar49;
        (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar43 - fVar52);
        (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar44 - fVar2);
        uVar35 = uVar35 - 4;
        pauVar33 = pauVar33 + 1;
        _Var32._M_pi = _Var32._M_pi + 1;
        _Var30._M_pi = _Var30._M_pi + 1;
      }
      if (0 < (int)uVar35) {
        uVar35 = uVar35 + 1;
        lVar36 = 0;
        do {
          *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36) =
               *(float *)(*pauVar33 + lVar36) -
               *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + lVar36);
          lVar36 = lVar36 + 4;
          uVar35 = uVar35 - 1;
        } while (1 < uVar35);
      }
      if (length != 0) {
        fVar42 = value1 - value2;
        uVar31 = 0;
        do {
          fVar43 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar31 * 4);
          fVar44 = fVar43 - fVar42;
          uVar34 = -(uint)(fVar44 < 0.0);
          if (1.1920929e-07 <= (float)(~uVar34 & (uint)fVar44 | (uint)(fVar42 - fVar43) & uVar34)) {
            puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
            *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
            *(undefined4 *)(puVar29 + 1) = 0x2a;
            *(uint *)((long)puVar29 + 0xc) = length;
            __cxa_throw(puVar29,&Exception::typeinfo,0);
          }
          uVar31 = uVar31 + 1;
        } while (uVar37 != uVar31);
        _Var30._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        _Var32 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        pauVar33 = pauVar28;
        uVar34 = length;
        uVar35 = length;
        if (0xf < (int)length) {
          do {
            fVar43 = *(float *)(*pauVar33 + 4);
            fVar44 = *(float *)(*pauVar33 + 8);
            fVar49 = *(float *)(*pauVar33 + 0xc);
            fVar52 = *(float *)pauVar33[1];
            fVar2 = *(float *)(pauVar33[1] + 4);
            fVar3 = *(float *)(pauVar33[1] + 8);
            fVar4 = *(float *)(pauVar33[1] + 0xc);
            fVar5 = *(float *)pauVar33[2];
            fVar6 = *(float *)(pauVar33[2] + 4);
            fVar7 = *(float *)(pauVar33[2] + 8);
            fVar8 = *(float *)(pauVar33[2] + 0xc);
            fVar9 = *(float *)pauVar33[3];
            fVar10 = *(float *)(pauVar33[3] + 4);
            fVar11 = *(float *)(pauVar33[3] + 8);
            fVar12 = *(float *)(pauVar33[3] + 0xc);
            fVar13 = *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4);
            fVar14 = (float)(_Var32._M_pi)->_M_use_count;
            fVar15 = (float)(_Var32._M_pi)->_M_weak_count;
            fVar16 = *(float *)&_Var32._M_pi[1]._vptr__Sp_counted_base;
            fVar17 = *(float *)((long)&_Var32._M_pi[1]._vptr__Sp_counted_base + 4);
            fVar18 = (float)_Var32._M_pi[1]._M_use_count;
            fVar19 = (float)_Var32._M_pi[1]._M_weak_count;
            fVar20 = *(float *)&_Var32._M_pi[2]._vptr__Sp_counted_base;
            fVar21 = *(float *)((long)&_Var32._M_pi[2]._vptr__Sp_counted_base + 4);
            fVar22 = (float)_Var32._M_pi[2]._M_use_count;
            fVar23 = (float)_Var32._M_pi[2]._M_weak_count;
            fVar24 = *(float *)&_Var32._M_pi[3]._vptr__Sp_counted_base;
            fVar25 = *(float *)((long)&_Var32._M_pi[3]._vptr__Sp_counted_base + 4);
            fVar26 = (float)_Var32._M_pi[3]._M_use_count;
            fVar27 = (float)_Var32._M_pi[3]._M_weak_count;
            *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
                 *(float *)&(_Var32._M_pi)->_vptr__Sp_counted_base * *(float *)*pauVar33;
            *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar13 * fVar43;
            (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar14 * fVar44);
            (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar15 * fVar49);
            *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar16 * fVar52;
            *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar17 * fVar2;
            _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar18 * fVar3);
            _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar19 * fVar4);
            *(float *)&_Var30._M_pi[2]._vptr__Sp_counted_base = fVar20 * fVar5;
            *(float *)((long)&_Var30._M_pi[2]._vptr__Sp_counted_base + 4) = fVar21 * fVar6;
            _Var30._M_pi[2]._M_use_count = (_Atomic_word)(fVar22 * fVar7);
            _Var30._M_pi[2]._M_weak_count = (_Atomic_word)(fVar23 * fVar8);
            *(float *)&_Var30._M_pi[3]._vptr__Sp_counted_base = fVar24 * fVar9;
            *(float *)((long)&_Var30._M_pi[3]._vptr__Sp_counted_base + 4) = fVar25 * fVar10;
            _Var30._M_pi[3]._M_use_count = (_Atomic_word)(fVar26 * fVar11);
            _Var30._M_pi[3]._M_weak_count = (_Atomic_word)(fVar27 * fVar12);
            uVar35 = uVar34 - 0x10;
            pauVar33 = pauVar33 + 4;
            _Var32._M_pi = _Var32._M_pi + 4;
            _Var30._M_pi = _Var30._M_pi + 4;
            bVar1 = 0x1f < uVar34;
            uVar34 = uVar35;
          } while (bVar1);
        }
        uVar34 = uVar35;
        if (7 < (int)uVar35) {
          do {
            fVar43 = *(float *)(*pauVar33 + 4);
            fVar44 = *(float *)(*pauVar33 + 8);
            fVar49 = *(float *)(*pauVar33 + 0xc);
            fVar52 = *(float *)pauVar33[1];
            fVar2 = *(float *)(pauVar33[1] + 4);
            fVar3 = *(float *)(pauVar33[1] + 8);
            fVar4 = *(float *)(pauVar33[1] + 0xc);
            fVar5 = *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4);
            fVar6 = (float)(_Var32._M_pi)->_M_use_count;
            fVar7 = (float)(_Var32._M_pi)->_M_weak_count;
            fVar8 = *(float *)&_Var32._M_pi[1]._vptr__Sp_counted_base;
            fVar9 = *(float *)((long)&_Var32._M_pi[1]._vptr__Sp_counted_base + 4);
            fVar10 = (float)_Var32._M_pi[1]._M_use_count;
            fVar11 = (float)_Var32._M_pi[1]._M_weak_count;
            *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
                 *(float *)&(_Var32._M_pi)->_vptr__Sp_counted_base * *(float *)*pauVar33;
            *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar5 * fVar43;
            (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar6 * fVar44);
            (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar7 * fVar49);
            *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar8 * fVar52;
            *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar9 * fVar2;
            _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar10 * fVar3);
            _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar11 * fVar4);
            uVar35 = uVar34 - 8;
            pauVar33 = pauVar33 + 2;
            _Var32._M_pi = _Var32._M_pi + 2;
            _Var30._M_pi = _Var30._M_pi + 2;
            bVar1 = 0xf < uVar34;
            uVar34 = uVar35;
          } while (bVar1);
        }
        if (3 < (int)uVar35) {
          fVar43 = *(float *)(*pauVar33 + 4);
          fVar44 = *(float *)(*pauVar33 + 8);
          fVar49 = *(float *)(*pauVar33 + 0xc);
          fVar52 = *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4);
          fVar2 = (float)(_Var32._M_pi)->_M_use_count;
          fVar3 = (float)(_Var32._M_pi)->_M_weak_count;
          *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
               *(float *)&(_Var32._M_pi)->_vptr__Sp_counted_base * *(float *)*pauVar33;
          *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar52 * fVar43;
          (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar2 * fVar44);
          (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar3 * fVar49);
          uVar35 = uVar35 - 4;
          pauVar33 = pauVar33 + 1;
          _Var32._M_pi = _Var32._M_pi + 1;
          _Var30._M_pi = _Var30._M_pi + 1;
        }
        if (0 < (int)uVar35) {
          uVar35 = uVar35 + 1;
          lVar36 = 0;
          do {
            *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36) =
                 *(float *)(*pauVar33 + lVar36) *
                 *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + lVar36);
            lVar36 = lVar36 + 4;
            uVar35 = uVar35 - 1;
          } while (1 < uVar35);
        }
        if (length != 0) {
          fVar43 = value1 * value2;
          uVar31 = 0;
          do {
            fVar44 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar31 * 4);
            fVar49 = fVar44 - fVar43;
            uVar34 = -(uint)(fVar49 < 0.0);
            if (1.1920929e-07 <= (float)(~uVar34 & (uint)fVar49 | (uint)(fVar43 - fVar44) & uVar34))
            {
              puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
              *(undefined4 *)(puVar29 + 1) = 0x32;
              *(uint *)((long)puVar29 + 0xc) = length;
              __cxa_throw(puVar29,&Exception::typeinfo,0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar37 != uVar31);
          _Var30 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          _Var32._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          pauVar33 = pauVar28;
          uVar34 = length;
          uVar35 = length;
          if (0xf < (int)length) {
            do {
              _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                       divps(*pauVar33,(undefined1  [16])*_Var30._M_pi);
              _Var50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                       divps(pauVar33[1],(undefined1  [16])_Var30._M_pi[1]);
              _Var53 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                       divps(pauVar33[2],(undefined1  [16])_Var30._M_pi[2]);
              _Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                       divps(pauVar33[3],(undefined1  [16])_Var30._M_pi[3]);
              *_Var32._M_pi = _Var45;
              _Var32._M_pi[1] = _Var50;
              _Var32._M_pi[2] = _Var53;
              _Var32._M_pi[3] = _Var54;
              uVar34 = uVar35 - 0x10;
              pauVar33 = pauVar33 + 4;
              _Var30._M_pi = _Var30._M_pi + 4;
              _Var32._M_pi = _Var32._M_pi + 4;
              bVar1 = 0x1f < uVar35;
              uVar35 = uVar34;
            } while (bVar1);
          }
          uVar35 = uVar34;
          if (7 < (int)uVar34) {
            do {
              _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                       divps(*pauVar33,(undefined1  [16])*_Var30._M_pi);
              _Var50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                       divps(pauVar33[1],(undefined1  [16])_Var30._M_pi[1]);
              *_Var32._M_pi = _Var45;
              _Var32._M_pi[1] = _Var50;
              uVar34 = uVar35 - 8;
              pauVar33 = pauVar33 + 2;
              _Var30._M_pi = _Var30._M_pi + 2;
              _Var32._M_pi = _Var32._M_pi + 2;
              bVar1 = 0xf < uVar35;
              uVar35 = uVar34;
            } while (bVar1);
          }
          if (3 < (int)uVar34) {
            _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                     divps(*pauVar33,(undefined1  [16])*_Var30._M_pi);
            *_Var32._M_pi = _Var45;
            uVar34 = uVar34 - 4;
            pauVar33 = pauVar33 + 1;
            _Var30._M_pi = _Var30._M_pi + 1;
            _Var32._M_pi = _Var32._M_pi + 1;
          }
          if (0 < (int)uVar34) {
            uVar34 = uVar34 + 1;
            lVar36 = 0;
            do {
              *(float *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + lVar36) =
                   *(float *)(*pauVar33 + lVar36) /
                   *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36);
              lVar36 = lVar36 + 4;
              uVar34 = uVar34 - 1;
            } while (1 < uVar34);
          }
          if (length != 0) {
            fVar44 = value1 / value2;
            uVar31 = 0;
            do {
              fVar49 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                          _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar31 * 4);
              fVar52 = fVar49 - fVar44;
              uVar34 = -(uint)(fVar52 < 0.0);
              if (1.1920929e-07 <=
                  (float)(~uVar34 & (uint)fVar52 | (uint)(fVar44 - fVar49) & uVar34)) {
                puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
                *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
                *(undefined4 *)(puVar29 + 1) = 0x3a;
                *(uint *)((long)puVar29 + 0xc) = length;
                __cxa_throw(puVar29,&Exception::typeinfo,0);
              }
              uVar31 = uVar31 + 1;
            } while (uVar37 != uVar31);
            _Var30._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi;
            pauVar33 = pauVar28;
            uVar34 = length;
            uVar35 = length;
            if (0xf < (int)length) {
              do {
                fVar49 = *(float *)(*pauVar33 + 4);
                fVar52 = *(float *)(*pauVar33 + 8);
                fVar2 = *(float *)(*pauVar33 + 0xc);
                fVar3 = *(float *)pauVar33[1];
                fVar4 = *(float *)(pauVar33[1] + 4);
                fVar5 = *(float *)(pauVar33[1] + 8);
                fVar6 = *(float *)(pauVar33[1] + 0xc);
                fVar7 = *(float *)pauVar33[2];
                fVar8 = *(float *)(pauVar33[2] + 4);
                fVar9 = *(float *)(pauVar33[2] + 8);
                fVar10 = *(float *)(pauVar33[2] + 0xc);
                fVar11 = *(float *)pauVar33[3];
                fVar12 = *(float *)(pauVar33[3] + 4);
                fVar13 = *(float *)(pauVar33[3] + 8);
                fVar14 = *(float *)(pauVar33[3] + 0xc);
                *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = *(float *)*pauVar33 + value2;
                *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar49 + value2;
                (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar52 + value2);
                (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar2 + value2);
                *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar3 + value2;
                *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar4 + value2;
                _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar5 + value2);
                _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar6 + value2);
                *(float *)&_Var30._M_pi[2]._vptr__Sp_counted_base = fVar7 + value2;
                *(float *)((long)&_Var30._M_pi[2]._vptr__Sp_counted_base + 4) = fVar8 + value2;
                _Var30._M_pi[2]._M_use_count = (_Atomic_word)(fVar9 + value2);
                _Var30._M_pi[2]._M_weak_count = (_Atomic_word)(fVar10 + value2);
                *(float *)&_Var30._M_pi[3]._vptr__Sp_counted_base = fVar11 + value2;
                *(float *)((long)&_Var30._M_pi[3]._vptr__Sp_counted_base + 4) = fVar12 + value2;
                _Var30._M_pi[3]._M_use_count = (_Atomic_word)(fVar13 + value2);
                _Var30._M_pi[3]._M_weak_count = (_Atomic_word)(fVar14 + value2);
                uVar35 = uVar34 - 0x10;
                pauVar33 = pauVar33 + 4;
                _Var30._M_pi = _Var30._M_pi + 4;
                bVar1 = 0x1f < uVar34;
                uVar34 = uVar35;
              } while (bVar1);
            }
            uVar34 = uVar35;
            if (7 < (int)uVar35) {
              do {
                fVar49 = *(float *)(*pauVar33 + 4);
                fVar52 = *(float *)(*pauVar33 + 8);
                fVar2 = *(float *)(*pauVar33 + 0xc);
                fVar3 = *(float *)pauVar33[1];
                fVar4 = *(float *)(pauVar33[1] + 4);
                fVar5 = *(float *)(pauVar33[1] + 8);
                fVar6 = *(float *)(pauVar33[1] + 0xc);
                *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = *(float *)*pauVar33 + value2;
                *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar49 + value2;
                (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar52 + value2);
                (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar2 + value2);
                *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar3 + value2;
                *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar4 + value2;
                _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar5 + value2);
                _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar6 + value2);
                uVar35 = uVar34 - 8;
                pauVar33 = pauVar33 + 2;
                _Var30._M_pi = _Var30._M_pi + 2;
                bVar1 = 0xf < uVar34;
                uVar34 = uVar35;
              } while (bVar1);
            }
            if (3 < (int)uVar35) {
              fVar49 = *(float *)(*pauVar33 + 4);
              fVar52 = *(float *)(*pauVar33 + 8);
              fVar2 = *(float *)(*pauVar33 + 0xc);
              *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = *(float *)*pauVar33 + value2;
              *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar49 + value2;
              (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar52 + value2);
              (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar2 + value2);
              uVar35 = uVar35 - 4;
              pauVar33 = pauVar33 + 1;
              _Var30._M_pi = _Var30._M_pi + 1;
            }
            if (0 < (int)uVar35) {
              uVar35 = uVar35 + 1;
              lVar36 = 0;
              do {
                *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36) =
                     *(float *)(*pauVar33 + lVar36) + value2;
                lVar36 = lVar36 + 4;
                uVar35 = uVar35 - 1;
              } while (1 < uVar35);
            }
            if (length != 0) {
              uVar31 = 0;
              do {
                fVar49 = *(float *)((long)&(pv2.
                                            super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                            _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar31 * 4)
                ;
                fVar52 = fVar49 - fVar41;
                uVar34 = -(uint)(fVar52 < 0.0);
                if (1.1920929e-07 <=
                    (float)(~uVar34 & (uint)fVar52 | (uint)(fVar41 - fVar49) & uVar34)) {
                  puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
                  *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
                  *(undefined4 *)(puVar29 + 1) = 0x43;
                  *(uint *)((long)puVar29 + 0xc) = length;
                  __cxa_throw(puVar29,&Exception::typeinfo,0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar37 != uVar31);
              _Var30._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi;
              pauVar33 = pauVar28;
              uVar34 = length;
              uVar35 = length;
              if (0xf < (int)length) {
                do {
                  fVar41 = *(float *)(*pauVar33 + 4);
                  fVar49 = *(float *)(*pauVar33 + 8);
                  fVar52 = *(float *)(*pauVar33 + 0xc);
                  fVar2 = *(float *)pauVar33[1];
                  fVar3 = *(float *)(pauVar33[1] + 4);
                  fVar4 = *(float *)(pauVar33[1] + 8);
                  fVar5 = *(float *)(pauVar33[1] + 0xc);
                  fVar6 = *(float *)pauVar33[2];
                  fVar7 = *(float *)(pauVar33[2] + 4);
                  fVar8 = *(float *)(pauVar33[2] + 8);
                  fVar9 = *(float *)(pauVar33[2] + 0xc);
                  fVar10 = *(float *)pauVar33[3];
                  fVar11 = *(float *)(pauVar33[3] + 4);
                  fVar12 = *(float *)(pauVar33[3] + 8);
                  fVar13 = *(float *)(pauVar33[3] + 0xc);
                  *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = *(float *)*pauVar33 - value2;
                  *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar41 - value2;
                  (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar49 - value2);
                  (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar52 - value2);
                  *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar2 - value2;
                  *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar3 - value2;
                  _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar4 - value2);
                  _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar5 - value2);
                  *(float *)&_Var30._M_pi[2]._vptr__Sp_counted_base = fVar6 - value2;
                  *(float *)((long)&_Var30._M_pi[2]._vptr__Sp_counted_base + 4) = fVar7 - value2;
                  _Var30._M_pi[2]._M_use_count = (_Atomic_word)(fVar8 - value2);
                  _Var30._M_pi[2]._M_weak_count = (_Atomic_word)(fVar9 - value2);
                  *(float *)&_Var30._M_pi[3]._vptr__Sp_counted_base = fVar10 - value2;
                  *(float *)((long)&_Var30._M_pi[3]._vptr__Sp_counted_base + 4) = fVar11 - value2;
                  _Var30._M_pi[3]._M_use_count = (_Atomic_word)(fVar12 - value2);
                  _Var30._M_pi[3]._M_weak_count = (_Atomic_word)(fVar13 - value2);
                  uVar35 = uVar34 - 0x10;
                  pauVar33 = pauVar33 + 4;
                  _Var30._M_pi = _Var30._M_pi + 4;
                  bVar1 = 0x1f < uVar34;
                  uVar34 = uVar35;
                } while (bVar1);
              }
              uVar34 = uVar35;
              if (7 < (int)uVar35) {
                do {
                  fVar41 = *(float *)(*pauVar33 + 4);
                  fVar49 = *(float *)(*pauVar33 + 8);
                  fVar52 = *(float *)(*pauVar33 + 0xc);
                  fVar2 = *(float *)pauVar33[1];
                  fVar3 = *(float *)(pauVar33[1] + 4);
                  fVar4 = *(float *)(pauVar33[1] + 8);
                  fVar5 = *(float *)(pauVar33[1] + 0xc);
                  *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = *(float *)*pauVar33 - value2;
                  *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar41 - value2;
                  (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar49 - value2);
                  (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar52 - value2);
                  *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar2 - value2;
                  *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar3 - value2;
                  _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar4 - value2);
                  _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar5 - value2);
                  uVar35 = uVar34 - 8;
                  pauVar33 = pauVar33 + 2;
                  _Var30._M_pi = _Var30._M_pi + 2;
                  bVar1 = 0xf < uVar34;
                  uVar34 = uVar35;
                } while (bVar1);
              }
              if (3 < (int)uVar35) {
                fVar41 = *(float *)(*pauVar33 + 4);
                fVar49 = *(float *)(*pauVar33 + 8);
                fVar52 = *(float *)(*pauVar33 + 0xc);
                *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = *(float *)*pauVar33 - value2;
                *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar41 - value2;
                (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar49 - value2);
                (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar52 - value2);
                uVar35 = uVar35 - 4;
                pauVar33 = pauVar33 + 1;
                _Var30._M_pi = _Var30._M_pi + 1;
              }
              if (0 < (int)uVar35) {
                uVar35 = uVar35 + 1;
                lVar36 = 0;
                do {
                  *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36) =
                       *(float *)(*pauVar33 + lVar36) - value2;
                  lVar36 = lVar36 + 4;
                  uVar35 = uVar35 - 1;
                } while (1 < uVar35);
              }
              if (length != 0) {
                uVar31 = 0;
                do {
                  fVar41 = *(float *)((long)&(pv2.
                                              super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                              _M_refcount._M_pi)->_vptr__Sp_counted_base +
                                     uVar31 * 4);
                  if ((fVar41 != fVar42) || (NAN(fVar41) || NAN(fVar42))) {
                    puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
                    *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
                    *(undefined4 *)(puVar29 + 1) = 0x4b;
                    *(uint *)((long)puVar29 + 0xc) = length;
                    __cxa_throw(puVar29,&Exception::typeinfo,0);
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar37 != uVar31);
                _Var30._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi;
                pauVar33 = pauVar28;
                uVar34 = length;
                uVar35 = length;
                if (0xf < (int)length) {
                  do {
                    fVar41 = *(float *)(*pauVar33 + 4);
                    fVar42 = *(float *)(*pauVar33 + 8);
                    fVar49 = *(float *)(*pauVar33 + 0xc);
                    fVar52 = *(float *)pauVar33[1];
                    fVar2 = *(float *)(pauVar33[1] + 4);
                    fVar3 = *(float *)(pauVar33[1] + 8);
                    fVar4 = *(float *)(pauVar33[1] + 0xc);
                    fVar5 = *(float *)pauVar33[2];
                    fVar6 = *(float *)(pauVar33[2] + 4);
                    fVar7 = *(float *)(pauVar33[2] + 8);
                    fVar8 = *(float *)(pauVar33[2] + 0xc);
                    fVar9 = *(float *)pauVar33[3];
                    fVar10 = *(float *)(pauVar33[3] + 4);
                    fVar11 = *(float *)(pauVar33[3] + 8);
                    fVar12 = *(float *)(pauVar33[3] + 0xc);
                    *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = value2 - *(float *)*pauVar33
                    ;
                    *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = value2 - fVar41;
                    (_Var30._M_pi)->_M_use_count = (_Atomic_word)(value2 - fVar42);
                    (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(value2 - fVar49);
                    *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = value2 - fVar52;
                    *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = value2 - fVar2;
                    _Var30._M_pi[1]._M_use_count = (_Atomic_word)(value2 - fVar3);
                    _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(value2 - fVar4);
                    *(float *)&_Var30._M_pi[2]._vptr__Sp_counted_base = value2 - fVar5;
                    *(float *)((long)&_Var30._M_pi[2]._vptr__Sp_counted_base + 4) = value2 - fVar6;
                    _Var30._M_pi[2]._M_use_count = (_Atomic_word)(value2 - fVar7);
                    _Var30._M_pi[2]._M_weak_count = (_Atomic_word)(value2 - fVar8);
                    *(float *)&_Var30._M_pi[3]._vptr__Sp_counted_base = value2 - fVar9;
                    *(float *)((long)&_Var30._M_pi[3]._vptr__Sp_counted_base + 4) = value2 - fVar10;
                    _Var30._M_pi[3]._M_use_count = (_Atomic_word)(value2 - fVar11);
                    _Var30._M_pi[3]._M_weak_count = (_Atomic_word)(value2 - fVar12);
                    uVar35 = uVar34 - 0x10;
                    pauVar33 = pauVar33 + 4;
                    _Var30._M_pi = _Var30._M_pi + 4;
                    bVar1 = 0x1f < uVar34;
                    uVar34 = uVar35;
                  } while (bVar1);
                }
                uVar34 = uVar35;
                if (7 < (int)uVar35) {
                  do {
                    fVar41 = *(float *)(*pauVar33 + 4);
                    fVar42 = *(float *)(*pauVar33 + 8);
                    fVar49 = *(float *)(*pauVar33 + 0xc);
                    fVar52 = *(float *)pauVar33[1];
                    fVar2 = *(float *)(pauVar33[1] + 4);
                    fVar3 = *(float *)(pauVar33[1] + 8);
                    fVar4 = *(float *)(pauVar33[1] + 0xc);
                    *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = value2 - *(float *)*pauVar33
                    ;
                    *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = value2 - fVar41;
                    (_Var30._M_pi)->_M_use_count = (_Atomic_word)(value2 - fVar42);
                    (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(value2 - fVar49);
                    *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = value2 - fVar52;
                    *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = value2 - fVar2;
                    _Var30._M_pi[1]._M_use_count = (_Atomic_word)(value2 - fVar3);
                    _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(value2 - fVar4);
                    uVar35 = uVar34 - 8;
                    pauVar33 = pauVar33 + 2;
                    _Var30._M_pi = _Var30._M_pi + 2;
                    bVar1 = 0xf < uVar34;
                    uVar34 = uVar35;
                  } while (bVar1);
                }
                if (3 < (int)uVar35) {
                  fVar41 = *(float *)(*pauVar33 + 4);
                  fVar42 = *(float *)(*pauVar33 + 8);
                  fVar49 = *(float *)(*pauVar33 + 0xc);
                  *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = value2 - *(float *)*pauVar33;
                  *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = value2 - fVar41;
                  (_Var30._M_pi)->_M_use_count = (_Atomic_word)(value2 - fVar42);
                  (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(value2 - fVar49);
                  uVar35 = uVar35 - 4;
                  pauVar33 = pauVar33 + 1;
                  _Var30._M_pi = _Var30._M_pi + 1;
                }
                if (0 < (int)uVar35) {
                  uVar35 = uVar35 + 1;
                  lVar36 = 0;
                  do {
                    *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36) =
                         value2 - *(float *)(*pauVar33 + lVar36);
                    lVar36 = lVar36 + 4;
                    uVar35 = uVar35 - 1;
                  } while (1 < uVar35);
                }
                if (length != 0) {
                  uVar31 = 0;
                  do {
                    fVar41 = *(float *)((long)&(pv2.
                                                super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                                       uVar31 * 4);
                    fVar42 = fVar41 - (value2 - value1);
                    uVar34 = -(uint)(fVar42 < 0.0);
                    if (1.1920929e-07 <=
                        (float)(~uVar34 & (uint)fVar42 | (uint)((value2 - value1) - fVar41) & uVar34
                               )) {
                      puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
                      *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
                      *(undefined4 *)(puVar29 + 1) = 0x53;
                      *(uint *)((long)puVar29 + 0xc) = length;
                      __cxa_throw(puVar29,&Exception::typeinfo,0);
                    }
                    uVar31 = uVar31 + 1;
                  } while (uVar37 != uVar31);
                  _Var30._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi;
                  pauVar33 = pauVar28;
                  uVar34 = length;
                  uVar35 = length;
                  if (0xf < (int)length) {
                    do {
                      fVar41 = *(float *)(*pauVar33 + 4);
                      fVar42 = *(float *)(*pauVar33 + 8);
                      fVar49 = *(float *)(*pauVar33 + 0xc);
                      fVar52 = *(float *)pauVar33[1];
                      fVar2 = *(float *)(pauVar33[1] + 4);
                      fVar3 = *(float *)(pauVar33[1] + 8);
                      fVar4 = *(float *)(pauVar33[1] + 0xc);
                      fVar5 = *(float *)pauVar33[2];
                      fVar6 = *(float *)(pauVar33[2] + 4);
                      fVar7 = *(float *)(pauVar33[2] + 8);
                      fVar8 = *(float *)(pauVar33[2] + 0xc);
                      fVar9 = *(float *)pauVar33[3];
                      fVar10 = *(float *)(pauVar33[3] + 4);
                      fVar11 = *(float *)(pauVar33[3] + 8);
                      fVar12 = *(float *)(pauVar33[3] + 0xc);
                      *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
                           *(float *)*pauVar33 * value2;
                      *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) =
                           fVar41 * value2;
                      (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar42 * value2);
                      (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar49 * value2);
                      *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar52 * value2;
                      *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar2 * value2
                      ;
                      _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar3 * value2);
                      _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar4 * value2);
                      *(float *)&_Var30._M_pi[2]._vptr__Sp_counted_base = fVar5 * value2;
                      *(float *)((long)&_Var30._M_pi[2]._vptr__Sp_counted_base + 4) = fVar6 * value2
                      ;
                      _Var30._M_pi[2]._M_use_count = (_Atomic_word)(fVar7 * value2);
                      _Var30._M_pi[2]._M_weak_count = (_Atomic_word)(fVar8 * value2);
                      *(float *)&_Var30._M_pi[3]._vptr__Sp_counted_base = fVar9 * value2;
                      *(float *)((long)&_Var30._M_pi[3]._vptr__Sp_counted_base + 4) =
                           fVar10 * value2;
                      _Var30._M_pi[3]._M_use_count = (_Atomic_word)(fVar11 * value2);
                      _Var30._M_pi[3]._M_weak_count = (_Atomic_word)(fVar12 * value2);
                      uVar35 = uVar34 - 0x10;
                      pauVar33 = pauVar33 + 4;
                      _Var30._M_pi = _Var30._M_pi + 4;
                      bVar1 = 0x1f < uVar34;
                      uVar34 = uVar35;
                    } while (bVar1);
                  }
                  uVar34 = uVar35;
                  if (7 < (int)uVar35) {
                    do {
                      fVar41 = *(float *)(*pauVar33 + 4);
                      fVar42 = *(float *)(*pauVar33 + 8);
                      fVar49 = *(float *)(*pauVar33 + 0xc);
                      fVar52 = *(float *)pauVar33[1];
                      fVar2 = *(float *)(pauVar33[1] + 4);
                      fVar3 = *(float *)(pauVar33[1] + 8);
                      fVar4 = *(float *)(pauVar33[1] + 0xc);
                      *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base =
                           *(float *)*pauVar33 * value2;
                      *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) =
                           fVar41 * value2;
                      (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar42 * value2);
                      (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar49 * value2);
                      *(float *)&_Var30._M_pi[1]._vptr__Sp_counted_base = fVar52 * value2;
                      *(float *)((long)&_Var30._M_pi[1]._vptr__Sp_counted_base + 4) = fVar2 * value2
                      ;
                      _Var30._M_pi[1]._M_use_count = (_Atomic_word)(fVar3 * value2);
                      _Var30._M_pi[1]._M_weak_count = (_Atomic_word)(fVar4 * value2);
                      uVar35 = uVar34 - 8;
                      pauVar33 = pauVar33 + 2;
                      _Var30._M_pi = _Var30._M_pi + 2;
                      bVar1 = 0xf < uVar34;
                      uVar34 = uVar35;
                    } while (bVar1);
                  }
                  if (3 < (int)uVar35) {
                    fVar41 = *(float *)(*pauVar33 + 4);
                    fVar42 = *(float *)(*pauVar33 + 8);
                    fVar49 = *(float *)(*pauVar33 + 0xc);
                    *(float *)&(_Var30._M_pi)->_vptr__Sp_counted_base = *(float *)*pauVar33 * value2
                    ;
                    *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + 4) = fVar41 * value2;
                    (_Var30._M_pi)->_M_use_count = (_Atomic_word)(fVar42 * value2);
                    (_Var30._M_pi)->_M_weak_count = (_Atomic_word)(fVar49 * value2);
                    uVar35 = uVar35 - 4;
                    pauVar33 = pauVar33 + 1;
                    _Var30._M_pi = _Var30._M_pi + 1;
                  }
                  if (0 < (int)uVar35) {
                    uVar35 = uVar35 + 1;
                    lVar36 = 0;
                    do {
                      *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36) =
                           *(float *)(*pauVar33 + lVar36) * value2;
                      lVar36 = lVar36 + 4;
                      uVar35 = uVar35 - 1;
                    } while (1 < uVar35);
                  }
                  if (length != 0) {
                    uVar31 = 0;
                    do {
                      fVar41 = *(float *)((long)&(pv2.
                                                  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                                         uVar31 * 4);
                      if ((fVar41 != fVar43) || (NAN(fVar41) || NAN(fVar43))) {
                        puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
                        *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
                        *(undefined4 *)(puVar29 + 1) = 0x5b;
                        *(uint *)((long)puVar29 + 0xc) = length;
                        __cxa_throw(puVar29,&Exception::typeinfo,0);
                      }
                      uVar31 = uVar31 + 1;
                    } while (uVar37 != uVar31);
                    _Var30._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi;
                    pauVar33 = pauVar28;
                    uVar34 = length;
                    uVar35 = length;
                    if (0xf < (int)length) {
                      do {
                        _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                 divps(*pauVar33,(undefined1  [16])_Var38);
                        _Var50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                 divps(pauVar33[1],(undefined1  [16])_Var38);
                        _Var53 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                 divps(pauVar33[2],(undefined1  [16])_Var38);
                        _Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                 divps(pauVar33[3],(undefined1  [16])_Var38);
                        *_Var30._M_pi = _Var45;
                        _Var30._M_pi[1] = _Var50;
                        _Var30._M_pi[2] = _Var53;
                        _Var30._M_pi[3] = _Var54;
                        uVar35 = uVar34 - 0x10;
                        pauVar33 = pauVar33 + 4;
                        _Var30._M_pi = _Var30._M_pi + 4;
                        bVar1 = 0x1f < uVar34;
                        uVar34 = uVar35;
                      } while (bVar1);
                    }
                    uVar34 = uVar35;
                    if (7 < (int)uVar35) {
                      do {
                        _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                 divps(*pauVar33,(undefined1  [16])_Var38);
                        _Var50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                 divps(pauVar33[1],(undefined1  [16])_Var38);
                        *_Var30._M_pi = _Var45;
                        _Var30._M_pi[1] = _Var50;
                        uVar35 = uVar34 - 8;
                        pauVar33 = pauVar33 + 2;
                        _Var30._M_pi = _Var30._M_pi + 2;
                        bVar1 = 0xf < uVar34;
                        uVar34 = uVar35;
                      } while (bVar1);
                    }
                    if (3 < (int)uVar35) {
                      _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                               divps(*pauVar33,(undefined1  [16])_Var38);
                      *_Var30._M_pi = _Var45;
                      uVar35 = uVar35 - 4;
                      pauVar33 = pauVar33 + 1;
                      _Var30._M_pi = _Var30._M_pi + 1;
                    }
                    if (0 < (int)uVar35) {
                      uVar35 = uVar35 + 1;
                      lVar36 = 0;
                      do {
                        *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36) =
                             *(float *)(*pauVar33 + lVar36) / value2;
                        lVar36 = lVar36 + 4;
                        uVar35 = uVar35 - 1;
                      } while (1 < uVar35);
                    }
                    if (length != 0) {
                      uVar31 = 0;
                      do {
                        fVar41 = *(float *)((long)&(pv2.
                                                  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                                           uVar31 * 4);
                        fVar42 = fVar41 - fVar44;
                        uVar34 = -(uint)(fVar42 < 0.0);
                        if (1.1920929e-07 <=
                            (float)(~uVar34 & (uint)fVar42 | (uint)(fVar44 - fVar41) & uVar34)) {
                          puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
                          *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
                          *(undefined4 *)(puVar29 + 1) = 99;
                          *(uint *)((long)puVar29 + 0xc) = length;
                          __cxa_throw(puVar29,&Exception::typeinfo,0);
                        }
                        uVar31 = uVar31 + 1;
                      } while (uVar37 != uVar31);
                      _Var30._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi;
                      uVar34 = length;
                      uVar35 = length;
                      if (0xf < (int)length) {
                        do {
                          auVar51._8_4_ = value2;
                          auVar51._0_8_ = _Var38._vptr__Sp_counted_base;
                          auVar51._12_4_ = value2;
                          _Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                   divps(auVar51,*pauVar28);
                          auVar39._8_4_ = value2;
                          auVar39._0_8_ = _Var38._vptr__Sp_counted_base;
                          auVar39._12_4_ = value2;
                          _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                   divps(auVar39,pauVar28[1]);
                          auVar46._8_4_ = value2;
                          auVar46._0_8_ = _Var38._vptr__Sp_counted_base;
                          auVar46._12_4_ = value2;
                          _Var50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                   divps(auVar46,pauVar28[2]);
                          auVar47._8_4_ = value2;
                          auVar47._0_8_ = _Var38._vptr__Sp_counted_base;
                          auVar47._12_4_ = value2;
                          _Var53 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                   divps(auVar47,pauVar28[3]);
                          *_Var30._M_pi = _Var54;
                          _Var30._M_pi[1] = _Var45;
                          _Var30._M_pi[2] = _Var50;
                          _Var30._M_pi[3] = _Var53;
                          uVar34 = uVar35 - 0x10;
                          pauVar28 = pauVar28 + 4;
                          _Var30._M_pi = _Var30._M_pi + 4;
                          bVar1 = 0x1f < uVar35;
                          uVar35 = uVar34;
                        } while (bVar1);
                      }
                      uVar35 = uVar34;
                      if (7 < (int)uVar34) {
                        do {
                          auVar48._8_4_ = value2;
                          auVar48._0_8_ = _Var38._vptr__Sp_counted_base;
                          auVar48._12_4_ = value2;
                          _Var50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                   divps(auVar48,*pauVar28);
                          auVar40._8_4_ = value2;
                          auVar40._0_8_ = _Var38._vptr__Sp_counted_base;
                          auVar40._12_4_ = value2;
                          _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                   divps(auVar40,pauVar28[1]);
                          *_Var30._M_pi = _Var50;
                          _Var30._M_pi[1] = _Var45;
                          uVar34 = uVar35 - 8;
                          pauVar28 = pauVar28 + 2;
                          _Var30._M_pi = _Var30._M_pi + 2;
                          bVar1 = 0xf < uVar35;
                          uVar35 = uVar34;
                        } while (bVar1);
                      }
                      if (3 < (int)uVar34) {
                        _Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                                 divps((undefined1  [16])_Var38,*pauVar28);
                        *_Var30._M_pi = _Var38;
                        uVar34 = uVar34 - 4;
                        pauVar28 = pauVar28 + 1;
                        _Var30._M_pi = _Var30._M_pi + 1;
                      }
                      if (0 < (int)uVar34) {
                        uVar34 = uVar34 + 1;
                        lVar36 = 0;
                        do {
                          *(float *)((long)&(_Var30._M_pi)->_vptr__Sp_counted_base + lVar36) =
                               value2 / *(float *)(*pauVar28 + lVar36);
                          lVar36 = lVar36 + 4;
                          uVar34 = uVar34 - 1;
                        } while (1 < uVar34);
                      }
                      if (length != 0) {
                        uVar31 = 0;
                        do {
                          fVar41 = *(float *)((long)&(pv2.
                                                  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                                             uVar31 * 4);
                          fVar42 = fVar41 - value2 / value1;
                          uVar34 = -(uint)(fVar42 < 0.0);
                          if (1.1920929e-07 <=
                              (float)(~uVar34 & (uint)fVar42 |
                                     (uint)(value2 / value1 - fVar41) & uVar34)) {
                            puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
                            *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
                            *(undefined4 *)(puVar29 + 1) = 0x6b;
                            *(uint *)((long)puVar29 + 0xc) = length;
                            __cxa_throw(puVar29,&Exception::typeinfo,0);
                          }
                          uVar31 = uVar31 + 1;
                        } while (uVar37 != uVar31);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((!allowTrash) &&
     ((fVar41 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar37 * 4),
      fVar41 != 127.0 || (NAN(fVar41))))) {
    puVar29 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar29 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
    *(undefined4 *)(puVar29 + 1) = 0x70;
    *(uint *)((long)puVar29 + 0xc) = length;
    __cxa_throw(puVar29,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}